

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

bool __thiscall MinVR::VRVector3::operator==(VRVector3 *this,VRVector3 *v)

{
  long in_RSI;
  long in_RDI;
  double dVar1;
  undefined1 local_11;
  
  dVar1 = std::fabs((double)(ulong)(uint)(*(float *)(in_RSI + 8) - *(float *)(in_RDI + 8)));
  local_11 = false;
  if (SUB84(dVar1,0) < 1e-08) {
    dVar1 = std::fabs((double)(ulong)(uint)(*(float *)(in_RSI + 0xc) - *(float *)(in_RDI + 0xc)));
    local_11 = false;
    if (SUB84(dVar1,0) < 1e-08) {
      dVar1 = std::fabs((double)(ulong)(uint)(*(float *)(in_RSI + 0x10) - *(float *)(in_RDI + 0x10))
                       );
      local_11 = SUB84(dVar1,0) < 1e-08;
    }
  }
  return local_11;
}

Assistant:

bool VRVector3::operator==(const VRVector3& v) const {
  return (fabs(v.x - x) < VRMATH_EPSILON && 
    fabs(v.y - y) < VRMATH_EPSILON && 
    fabs(v.z - z) < VRMATH_EPSILON);
}